

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O0

bilingual_str *
tinyformat::format<int,int,wallet::WalletFeature>
          (bilingual_str *fmt,int *args,int *args_1,WalletFeature *args_2)

{
  long lVar1;
  int *args_00;
  string *fmt_00;
  anon_class_1_0_00000001 *this;
  int *in_RSI;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 translate_arg;
  undefined1 in_stack_ffffffffffffff4f;
  WalletFeature *in_stack_ffffffffffffff50;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  args_00 = format<int,int,wallet::WalletFeature>(bilingual_str_const&,int_const&,int_const&,wallet::WalletFeature_const&)
            ::{lambda(auto:1_const&,bool)#1}::operator()
                      (in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,
                       (bool)in_stack_ffffffffffffff4f);
  fmt_00 = (string *)
           format<int,int,wallet::WalletFeature>(bilingual_str_const&,int_const&,int_const&,wallet::WalletFeature_const&)
           ::{lambda(auto:1_const&,bool)#1}::operator()
                     (in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,
                      (bool)in_stack_ffffffffffffff4f);
  format<int,int,wallet::WalletFeature>(bilingual_str_const&,int_const&,int_const&,wallet::WalletFeature_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
  format<int,int,wallet::WalletFeature>
            (fmt_00,args_00,in_RSI,(WalletFeature *)CONCAT44(uVar2,in_stack_ffffffffffffff70));
  format<int,int,wallet::WalletFeature>(bilingual_str_const&,int_const&,int_const&,wallet::WalletFeature_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,
             (bool)in_stack_ffffffffffffff4f);
  this = (anon_class_1_0_00000001 *)
         format<int,int,wallet::WalletFeature>(bilingual_str_const&,int_const&,int_const&,wallet::WalletFeature_const&)
         ::{lambda(auto:1_const&,bool)#1}::operator()
                   (in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,
                    (bool)in_stack_ffffffffffffff4f);
  format<int,int,wallet::WalletFeature>(bilingual_str_const&,int_const&,int_const&,wallet::WalletFeature_const&)
  ::{lambda(auto:1_const&,bool)#1}::operator()
            (this,in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
  format<int,int,wallet::WalletFeature>
            (fmt_00,args_00,in_RSI,(WalletFeature *)CONCAT44(uVar2,in_stack_ffffffffffffff70));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}